

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eps,
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  long in_RCX;
  long in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int *in_R8;
  int in_R9D;
  int m;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rval;
  int *idx;
  int *rbeg;
  int *rlen;
  int *ridx;
  int *cperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb88;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffb94;
  self_type *in_stack_fffffffffffffb98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffba0;
  undefined1 local_434 [28];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbe8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbf0;
  undefined1 local_3fc [56];
  undefined1 local_3c4 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_38c;
  undefined1 local_354 [56];
  undefined4 local_31c;
  int local_318;
  undefined1 local_314 [56];
  undefined1 local_2dc [56];
  undefined4 local_2a4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  int *local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  undefined1 local_244 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_20c;
  int local_1d4;
  int *local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined4 *local_180;
  long local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  long local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  long local_f8;
  long local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  long local_d8;
  long local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_190 = &local_20c;
  local_1d4 = in_R9D;
  local_1d0 = in_R8;
  local_1c8 = in_RCX;
  local_1c0 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
  local_188 = local_244;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
  local_260 = *(long *)(in_RDI[5].data._M_elems + 4);
  local_268 = *(long *)(in_RDI[5].data._M_elems + 8);
  local_270._0_4_ = in_RDI[5].exp;
  local_270._4_1_ = in_RDI[5].neg;
  local_270._5_3_ = *(undefined3 *)&in_RDI[5].field_0x2d;
  local_248 = 0;
  while (local_248 < local_1d4) {
    enQueueMin(local_1d0,&local_248,*(int *)(local_270 + (long)local_1d0[local_248] * 4));
  }
  local_278._0_4_ = in_RDI[9].fpclass;
  local_278._4_4_ = in_RDI[9].prec_elem;
  local_298 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x36bb19);
  local_280 = *(long *)(in_RDI[10].data._M_elems + 2);
  local_288 = *(long *)in_RDI[10].data._M_elems;
  while (0 < local_1d4) {
    local_248 = deQueueMin(local_1d0,&local_1d4);
    local_258 = *(int *)(local_268 + (long)local_248 * 4);
    local_d0 = local_1c8 + (long)local_258 * 0x38;
    local_c8 = &local_20c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
    local_2a4 = 0;
    local_178 = local_1c8 + (long)local_258 * 0x38;
    local_180 = &local_2a4;
    local_c0 = local_180;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RDI,(long_long_type)in_RSI);
    local_168 = local_2dc;
    local_170 = &local_20c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
    local_158 = local_314;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    if (bVar2) {
      local_254 = *(int *)(local_260 + (long)local_248 * 4);
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)(in_RDI[8].data._M_elems + 4),(long)local_254);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_d8 = local_1c0 + (long)local_254 * 0x38;
      local_e0 = &local_20c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
      local_250 = *(int *)(local_288 + (long)local_254 * 4);
      local_290 = (int *)(local_278 + (long)local_250 * 4);
      local_2a0 = local_298 + local_250;
      for (local_318 = *(int *)(local_280 + (long)local_254 * 4); local_318 != 0;
          local_318 = local_318 + -1) {
        local_24c = *local_290;
        local_f0 = local_1c8 + (long)local_24c * 0x38;
        local_e8 = local_244;
        local_290 = local_290 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
        local_31c = 0;
        tVar3 = boost::multiprecision::operator==(in_stack_fffffffffffffb88,(int *)in_RDI);
        pnVar1 = local_2a0;
        if (tVar3) {
          local_20 = &local_38c;
          local_28 = &local_20c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &local_38c;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RDI,in_RSI);
          local_8 = &local_38c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDI);
          pnVar1 = local_2a0;
          local_58 = local_354;
          local_60 = &local_38c;
          local_68 = local_2a0;
          local_2a0 = local_2a0 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,pnVar1);
          local_50 = local_354;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
          local_38 = local_354;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RDI,in_RSI,(cpp_dec_float<50U,_int,_void> *)0x36bf96);
          local_108 = local_244;
          local_110 = local_354;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
          local_148 = local_3c4;
          local_150 = local_244;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RDI,in_RSI);
          local_138 = local_3fc;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RDI,in_RSI);
          bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          if (bVar2) {
            local_f8 = local_1c8 + (long)local_24c * 0x38;
            local_100 = local_244;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI)
            ;
            enQueueMin(local_1d0,&local_1d4,*(int *)(local_270 + (long)local_24c * 4));
          }
        }
        else {
          local_98 = local_434;
          local_a0 = &local_20c;
          local_a8 = local_2a0;
          local_2a0 = local_2a0 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,pnVar1);
          local_90 = local_434;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
          local_78 = local_434;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RDI,in_RSI,(cpp_dec_float<50U,_int,_void> *)0x36c17a);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          uVar4 = 0;
          tVar3 = boost::multiprecision::operator!=(in_stack_fffffffffffffb88,(int *)in_RDI);
          if (tVar3) {
            local_128 = &stack0xfffffffffffffb94;
            local_130 = local_244;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_RDI,in_RSI);
          }
          else {
            in_stack_fffffffffffffb88 =
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)0x2b2bff2ee48e0530;
            local_198 = &stack0xfffffffffffffb94;
            local_1a0 = &stack0xfffffffffffffb88;
            local_1a8 = 0;
            local_b8 = local_1a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_fffffffffffffb94,uVar4),
                       1e-100,in_RDI);
          }
          local_118 = local_1c8 + (long)local_24c * 0x38;
          local_120 = &stack0xfffffffffffffb94;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
        }
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}